

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscPStackEntry.h
# Opt level: O3

void __thiscall CNscPStackEntry::GetVector(CNscPStackEntry *this,float *pv)

{
  uchar *puVar1;
  
  if (this->m_nType != NscType_Vector) {
    __assert_fail("m_nType == NscType_Vector",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                  ,0x159,"void CNscPStackEntry::GetVector(float *) const");
  }
  if (this->m_nDataSize != 0x20) {
    __assert_fail("m_nDataSize == sizeof (NscPCodeConstantVector)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                  ,0x15a,"void CNscPStackEntry::GetVector(float *) const");
  }
  puVar1 = this->m_pauchData;
  if (*(int *)(puVar1 + 8) != 0x34) {
    __assert_fail("p ->nOpCode == NscPCode_Constant",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                  ,0x15c,"void CNscPStackEntry::GetVector(float *) const");
  }
  if (*(int *)(puVar1 + 0xc) == 10) {
    *pv = *(float *)(puVar1 + 0x10);
    pv[1] = *(float *)(puVar1 + 0x14);
    pv[2] = *(float *)(puVar1 + 0x18);
    return;
  }
  __assert_fail("p ->nType == NscType_Vector",
                "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                ,0x15d,"void CNscPStackEntry::GetVector(float *) const");
}

Assistant:

void GetVector (float *pv) const
	{
		assert (m_nType == NscType_Vector);
		assert (m_nDataSize == sizeof (NscPCodeConstantVector));
		NscPCodeConstantVector *p = (NscPCodeConstantVector *) m_pauchData;
		assert (p ->nOpCode == NscPCode_Constant);
		assert (p ->nType == NscType_Vector);
		pv [0] = p ->v [0];
		pv [1] = p ->v [1];
		pv [2] = p ->v [2];
		return;
	}